

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t terminal_settc(EditLine *el,wchar_t argc,wchar_t **argv)

{
  int iVar1;
  undefined4 uVar2;
  wchar_t wVar3;
  char *pcVar4;
  long lVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  wchar_t lins;
  char *__format;
  FILE *__stream;
  termcapstr *t;
  long lVar8;
  char how [8];
  char what [8];
  char *ep;
  
  if (((argv != (wchar_t **)0x0) && (argv[1] != (wchar_t *)0x0)) && (argv[2] != (wchar_t *)0x0)) {
    pcVar4 = ct_encode_string(argv[1],&el->el_scratch);
    strlcpy(what,pcVar4,8);
    pcVar4 = ct_encode_string(argv[2],&el->el_scratch);
    strlcpy(how,pcVar4,8);
    for (t = tstr; t->name != (char *)0x0; t = t + 1) {
      iVar1 = strcmp(t->name,what);
      if (iVar1 == 0) {
        terminal_alloc(el,t,how);
        goto LAB_00111168;
      }
    }
    lVar8 = 0;
    for (uVar7 = 0; pcVar4 = *(char **)((long)&tval[0].name + uVar7), pcVar4 != (char *)0x0;
        uVar7 = uVar7 + 0x10) {
      iVar1 = strcmp(pcVar4,what);
      if (iVar1 == 0) {
        if (uVar7 < 0x20 || (uVar7 & 0x7fffffffffffffd0) == 0x40) {
          if (how._0_4_ == 0x736579) {
            uVar2 = 1;
          }
          else {
            iVar1 = bcmp(how,"no",3);
            if (iVar1 != 0) {
              __stream = (FILE *)el->el_errfile;
              goto LAB_0011120b;
            }
            uVar2 = 0;
          }
          *(undefined4 *)((long)(el->el_terminal).t_val + lVar8) = uVar2;
LAB_00111168:
          terminal_setflags(el);
        }
        else {
          lVar5 = strtol(how,&ep,10);
          if (*ep != '\0') {
            __stream = (FILE *)el->el_errfile;
LAB_0011120b:
            pwVar6 = *argv;
            __format = "%ls: Bad value `%s\'.\n";
            pcVar4 = how;
            goto LAB_0011121a;
          }
          pwVar6 = (el->el_terminal).t_val;
          *(int *)((long)pwVar6 + lVar8) = (int)lVar5;
          if (uVar7 == 0x20) {
            lins = pwVar6[2];
            (el->el_terminal).t_size.h = lins;
            wVar3 = pwVar6[3];
          }
          else {
            if (uVar7 != 0x30) {
              return L'\0';
            }
            wVar3 = pwVar6[3];
            (el->el_terminal).t_size.v = wVar3;
            lins = pwVar6[2];
          }
          wVar3 = terminal_change_size(el,lins,wVar3);
          if (wVar3 == L'\xffffffff') {
            return L'\xffffffff';
          }
        }
        return L'\0';
      }
      lVar8 = lVar8 + 4;
    }
    __stream = (FILE *)el->el_errfile;
    pwVar6 = *argv;
    __format = "%ls: Bad capability `%s\'.\n";
    pcVar4 = what;
LAB_0011121a:
    fprintf(__stream,__format,pwVar6,pcVar4);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_settc(EditLine *el, int argc __attribute__((__unused__)),
    const wchar_t **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char what[8], how[8];
	long i;
	char *ep;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	strlcpy(what, ct_encode_string(argv[1], &el->el_scratch), sizeof(what));
	strlcpy(how,  ct_encode_string(argv[2], &el->el_scratch), sizeof(how));

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		terminal_alloc(el, ts, how);
		terminal_setflags(el);
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL) {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad capability `%s'.\n", argv[0], what);
		return -1;
	}

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		/*
		 * Booleans
		 */
		if (strcmp(how, "yes") == 0)
			el->el_terminal.t_val[tv - tval] = 1;
		else if (strcmp(how, "no") == 0)
			el->el_terminal.t_val[tv - tval] = 0;
		else {
			(void) fprintf(el->el_errfile,
			    "%ls: Bad value `%s'.\n", argv[0], how);
			return -1;
		}
		terminal_setflags(el);
		return 0;
	}

	/*
	 * Numerics
	 */
	i = strtol(how, &ep, 10);
	if (*ep != '\0') {
		(void) fprintf(el->el_errfile,
		    "%ls: Bad value `%s'.\n", argv[0], how);
		return -1;
	}
	el->el_terminal.t_val[tv - tval] = (int) i;
	i = 0;
	if (tv == &tval[T_co]) {
		el->el_terminal.t_size.v = Val(T_co);
		i++;
	} else if (tv == &tval[T_li]) {
		el->el_terminal.t_size.h = Val(T_li);
		i++;
	}
	if (i && terminal_change_size(el, Val(T_li), Val(T_co)) == -1)
		return -1;
	return 0;
}